

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5d835d::Db::parseSubstitution(Db *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  Node **ppNVar4;
  bool bVar5;
  int iVar6;
  Node *N;
  Node *pNVar7;
  undefined4 uVar8;
  Node *WithTags;
  Node *local_28;
  
  pcVar3 = this->First;
  if ((pcVar3 != this->Last) && (*pcVar3 == 'S')) {
    pcVar1 = pcVar3 + 1;
    this->First = pcVar1;
    if (this->Last == pcVar1) {
      iVar6 = islower(0);
      if (iVar6 != 0) {
        return (Node *)0x0;
      }
    }
    else {
      cVar2 = *pcVar1;
      iVar6 = islower((int)cVar2);
      if (iVar6 != 0) {
        uVar8 = 0;
        switch(cVar2) {
        case 'a':
          break;
        case 'b':
          uVar8 = 1;
          break;
        case 'c':
        case 'e':
        case 'f':
        case 'g':
        case 'h':
          return (Node *)0x0;
        case 'd':
          uVar8 = 5;
          break;
        case 'i':
          uVar8 = 3;
          break;
        default:
          if (cVar2 == 'o') {
            uVar8 = 4;
          }
          else {
            if (cVar2 != 's') {
              return (Node *)0x0;
            }
            uVar8 = 2;
          }
        }
        this->First = pcVar3 + 2;
        N = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x10);
        N->K = KSpecialSubstitution;
        N->RHSComponentCache = No;
        N->ArrayCache = No;
        N->FunctionCache = No;
        N->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e548;
        *(undefined4 *)&N->field_0xc = uVar8;
        pNVar7 = parseAbiTags(this,N);
        if (pNVar7 != N) {
          local_28 = pNVar7;
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&local_28);
          return pNVar7;
        }
        return N;
      }
      if (*pcVar1 == '_') {
        this->First = pcVar3 + 2;
        ppNVar4 = (this->Subs).First;
        if (ppNVar4 == (this->Subs).Last) {
          return (Node *)0x0;
        }
        return *ppNVar4;
      }
    }
    local_28 = (Node *)0x0;
    bVar5 = parseSeqId(this,(size_t *)&local_28);
    if (((!bVar5) && (pcVar3 = this->First, pcVar3 != this->Last)) && (*pcVar3 == '_')) {
      this->First = pcVar3 + 1;
      ppNVar4 = (this->Subs).First;
      if ((undefined1 *)((long)&local_28->_vptr_Node + 1U) <
          (undefined1 *)((long)(this->Subs).Last - (long)ppNVar4 >> 3)) {
        return ppNVar4[(long)((long)&local_28->_vptr_Node + 1)];
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }